

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall Lib::Stack<unsigned_int>::reserve(Stack<unsigned_int> *this,size_t capacity)

{
  uint *puVar1;
  size_t sVar2;
  ulong uVar3;
  uint *puVar4;
  ulong in_RSI;
  Stack<unsigned_int> *in_RDI;
  uint i;
  uint *mem;
  size_t in_stack_ffffffffffffffc0;
  uint local_1c;
  
  if (in_RDI->_capacity < in_RSI) {
    puVar1 = (uint *)Lib::alloc(in_stack_ffffffffffffffc0);
    if (in_RDI->_stack == (uint *)0x0) {
      in_RDI->_stack = puVar1;
      in_RDI->_cursor = puVar1;
      in_RDI->_capacity = in_RSI;
      in_RDI->_end = in_RDI->_stack + in_RDI->_capacity;
    }
    else {
      for (local_1c = 0; sVar2 = size(in_RDI), local_1c < sVar2; local_1c = local_1c + 1) {
        uVar3 = (ulong)local_1c;
        puVar4 = operator[](in_RDI,(ulong)local_1c);
        puVar1[uVar3] = *puVar4;
      }
      Lib::free(in_RDI->_stack);
      in_RDI->_cursor = puVar1 + ((long)in_RDI->_cursor - (long)in_RDI->_stack >> 2);
      in_RDI->_capacity = in_RSI;
      in_RDI->_stack = puVar1;
      in_RDI->_end = in_RDI->_stack + in_RDI->_capacity;
    }
  }
  return;
}

Assistant:

inline
  void reserve(size_t capacity) 
  {
    if (_capacity >= capacity) {
      return;
    }
    C* mem = static_cast<C*>(ALLOC_KNOWN(capacity*sizeof(C),className()));
    if (_stack) {
      for (unsigned i = 0; i < size(); i++) {
        ::new(&mem[i]) C(std::move((*this)[i]));
      }
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());

      _cursor = mem + (_cursor - _stack);
      _capacity = capacity;
      _stack = mem;
      _end = _stack + _capacity;
    } else {
      _stack = mem;
      _cursor = mem;
      _capacity = capacity;
      _end = _stack + _capacity;
    }
  }